

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

bool __thiscall
ON_SubD_FixedSizeHeap::Internal_ReserveSubDWorkspace
          (ON_SubD_FixedSizeHeap *this,size_t vertex_capacity,size_t face_capacity,
          size_t array_capacity,bool bEnableHash)

{
  ON_SubDVertex *pOVar1;
  ON_SubDEdge *pOVar2;
  ON_SubDFace *pOVar3;
  ON__UINT_PTR *pOVar4;
  ulong uVar5;
  size_t max_capacity;
  size_t edge_capacity;
  bool bEnableHash_local;
  size_t array_capacity_local;
  size_t face_capacity_local;
  size_t vertex_capacity_local;
  ON_SubD_FixedSizeHeap *this_local;
  
  if (((vertex_capacity == 0) || (face_capacity == 0)) || (array_capacity == 0)) {
    Destroy(this);
    ON_SubDIncrementErrorCount();
    this_local._7_1_ = false;
  }
  else {
    uVar5 = (vertex_capacity + face_capacity) - 1;
    if (((this->m_v_capacity < vertex_capacity) || (this->m_e_capacity < uVar5)) ||
       ((this->m_f_capacity < face_capacity || (this->m_p_capacity < array_capacity)))) {
      Destroy(this);
      if (((vertex_capacity < 0x1000000) && (uVar5 < 0x1000000)) &&
         ((face_capacity < 0x1000000 && (array_capacity < 0x1000000)))) {
        pOVar1 = (ON_SubDVertex *)ON_SubD__Allocate(vertex_capacity * 0x108);
        this->m_v = pOVar1;
        if ((this->m_v != (ON_SubDVertex *)0x0) || (vertex_capacity == 0)) {
          pOVar2 = (ON_SubDEdge *)ON_SubD__Allocate(uVar5 * 0xb0);
          this->m_e = pOVar2;
          if ((this->m_e != (ON_SubDEdge *)0x0) || (uVar5 == 0)) {
            pOVar3 = (ON_SubDFace *)ON_SubD__Allocate(face_capacity * 0xd8);
            this->m_f = pOVar3;
            if ((this->m_f != (ON_SubDFace *)0x0) || (face_capacity == 0)) {
              pOVar4 = (ON__UINT_PTR *)ON_SubD__Allocate(array_capacity << 3);
              this->m_p = pOVar4;
              if ((this->m_p != (ON__UINT_PTR *)0x0) || (array_capacity == 0)) {
                this->m_v_capacity = (uint)vertex_capacity;
                this->m_e_capacity = (uint)uVar5;
                this->m_f_capacity = (uint)face_capacity;
                this->m_p_capacity = (uint)array_capacity;
                if (bEnableHash) {
                  Internal_ReserveSubDWorkspace_HashTable(this);
                }
                else {
                  this->m_h_count = 0xffffffff;
                }
                return true;
              }
            }
          }
        }
        Destroy(this);
        ON_SubDIncrementErrorCount();
        this_local._7_1_ = false;
      }
      else {
        ON_SubDIncrementErrorCount();
        this_local._7_1_ = false;
      }
    }
    else {
      Reset(this);
      if (bEnableHash) {
        Internal_ReserveSubDWorkspace_HashTable(this);
      }
      else {
        this->m_h_count = 0xffffffff;
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubD_FixedSizeHeap::Internal_ReserveSubDWorkspace(
  size_t vertex_capacity,
  size_t face_capacity,
  size_t array_capacity,
  bool bEnableHash
  )
{
  if ( vertex_capacity <= 0 || face_capacity <= 0 || array_capacity <= 0)
  {
    Destroy();
    return ON_SUBD_RETURN_ERROR(false);
  }
  const size_t edge_capacity = vertex_capacity + face_capacity - 1; // Euler formula
  if (m_v_capacity >= vertex_capacity
    && m_e_capacity >= edge_capacity
    && m_f_capacity >= face_capacity
    && m_p_capacity >= array_capacity
    )
  {
    Reset();
    if (bEnableHash)
      Internal_ReserveSubDWorkspace_HashTable();
    else
      m_h_count = ON_SubD_FixedSizeHeap::DisabledHashCount;
    return true;
  }

  Destroy();

  size_t max_capacity = 0xFFFFFFU;
  if (vertex_capacity > max_capacity || edge_capacity > max_capacity || face_capacity > max_capacity || array_capacity > max_capacity)
    return ON_SUBD_RETURN_ERROR(false);

  for (;;)
  {
    m_v = (ON_SubDVertex*)ON_SubD__Allocate(vertex_capacity*sizeof(m_v[0]));
    if (nullptr == m_v && vertex_capacity > 0)
      break;
    m_e = (ON_SubDEdge*)ON_SubD__Allocate(edge_capacity*sizeof(m_e[0]));
    if (nullptr == m_e && edge_capacity > 0)
      break;
    m_f = (ON_SubDFace*)ON_SubD__Allocate(face_capacity*sizeof(m_f[0]));
    if (nullptr == m_f && face_capacity > 0)
      break;
    m_p = (ON__UINT_PTR*)ON_SubD__Allocate(array_capacity*sizeof(m_p[0]));
    if (nullptr == m_p && array_capacity > 0)
      break;

    m_v_capacity = (unsigned int)vertex_capacity;
    m_e_capacity = (unsigned int)edge_capacity;
    m_f_capacity = (unsigned int)face_capacity;
    m_p_capacity = (unsigned int)array_capacity;

    if (bEnableHash)
      Internal_ReserveSubDWorkspace_HashTable();
    else
      m_h_count = ON_SubD_FixedSizeHeap::DisabledHashCount;
    return true;
  }

  Destroy();

  return ON_SUBD_RETURN_ERROR(false);
}